

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportBuildFileGenerator *this,string *name,string *config)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  string fileName;
  string local_470;
  string se;
  string cxx_modules_dirname;
  ostringstream e;
  cmGeneratedFileStream os;
  
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
            (&cxx_modules_dirname,this);
  if (cxx_modules_dirname._M_string_length == 0) {
    bVar4 = true;
  }
  else {
    if (config->_M_string_length == 0) {
      std::__cxx11::string::assign((char *)config);
    }
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_1_ =
         0x2f;
    e = (ostringstream)0x2d;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char,std::__cxx11::string&,char_const(&)[7]>
              (&fileName,&(this->super_cmExportFileGenerator).FileDir,(char *)&os,
               &cxx_modules_dirname,(char (*) [14])0x7793dc,name,(char *)&e,config,
               (char (*) [7])0x73c2db);
    cmGeneratedFileStream::cmGeneratedFileStream(&os,&fileName,true,None);
    bVar4 = ((&os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [*(long *)(CONCAT71(os.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream._1_7_,
                                 os.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream._0_1_) + -0x18)] & 5) == 0;
    if (bVar4) {
      cmGeneratedFileStream::SetCopyIfDifferent(&os,true);
      for (p_Var3 = (this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 !=
          &(this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        this_00 = *(cmGeneratorTarget **)(p_Var3 + 1);
        bVar1 = cmGeneratorTarget::HaveCxx20ModuleSources(this_00,(string *)0x0);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&os,"include(\"${CMAKE_CURRENT_LIST_DIR}/target-");
          cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&e,this_00);
          poVar2 = std::operator<<(poVar2,(string *)&e);
          poVar2 = std::operator<<(poVar2,'-');
          poVar2 = std::operator<<(poVar2,(string *)config);
          std::operator<<(poVar2,".cmake\")\n");
          std::__cxx11::string::~string((string *)&e);
        }
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar2 = std::operator<<((ostream *)&e,"cannot write to file \"");
      poVar2 = std::operator<<(poVar2,(string *)&fileName);
      poVar2 = std::operator<<(poVar2,"\": ");
      std::operator<<(poVar2,(string *)&se);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&se);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&os);
    std::__cxx11::string::~string((string *)&fileName);
  }
  std::__cxx11::string::~string((string *)&cxx_modules_dirname);
  return bVar4;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion(
  std::string const& name, std::string config) const
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  if (config.empty()) {
    config = "noconfig";
  }

  std::string fileName =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, "/cxx-modules-", name,
             '-', config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  for (auto const* tgt : this->ExportedTargets) {
    // Only targets with C++ module sources will have a
    // collator-generated install script.
    if (!tgt->HaveCxx20ModuleSources()) {
      continue;
    }

    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/target-" << tgt->GetExportName()
       << '-' << config << ".cmake\")\n";
  }

  return true;
}